

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O3

void __thiscall
jhu::thrax::LabelTests_SAMTDoubleConcatComma_Test::TestBody
          (LabelTests_SAMTDoubleConcatComma_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *message;
  string_view line;
  AssertionResult gtest_ar;
  AssertHelper local_c0;
  string_view local_b8;
  internal local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  Tree local_98;
  SAMTLabeler local_78;
  
  line._M_str = "(ROOT baz (A foo) (, bar) (C qux))";
  line._M_len = 0x22;
  readTree(&local_98,line);
  local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &local_78.key_.label.field_2;
  local_78.super_Labeler._vptr_Labeler = (_func_int **)&PTR_operator___00168cf8;
  local_78.cache_.
  super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.cache_.
  super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_78.cache_.
  super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_78.cache_.
  super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_78._52_8_ = 0;
  local_78.key_.label._M_string_length = 0;
  local_78.key_.label.field_2._M_local_buf[0] = '\0';
  local_78.key_.label._M_dataplus._M_p = (pointer)paVar1;
  local_b8 = SAMTLabeler::operator()(&local_78,(SpanPair)0x4000100000000);
  testing::internal::CmpHelperEQ<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (local_a8,"\"A+COMMA+C\"","sl(SpanPair{{}, { 1, 4 }})",(char (*) [10])"A+COMMA+C",
             &local_b8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x8e,message);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_len != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_b8._M_len != (long *)0x0)) {
        (**(code **)(*(long *)local_b8._M_len + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.super_Labeler._vptr_Labeler = (_func_int **)&PTR_operator___00168cf8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.key_.label._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.key_.label._M_dataplus._M_p,
                    CONCAT71(local_78.key_.label.field_2._M_allocated_capacity._1_7_,
                             local_78.key_.label.field_2._M_local_buf[0]) + 1);
  }
  std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>::~vector
            (&local_78.cache_);
  if (local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.tree_.
                    super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.tree_.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.tree_.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(LabelTests, SAMTDoubleConcatComma) {
  auto t = readTree("(ROOT baz (A foo) (, bar) (C qux))");
  SAMTLabeler sl(std::move(t));
  EXPECT_EQ("A+COMMA+C", sl(SpanPair{{}, { 1, 4 }}));
}